

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_NewObjectProtoClass(JSContext *ctx,JSValue proto_val,JSClassID class_id)

{
  byte bVar1;
  JSShape **ppJVar2;
  JSShape *sh;
  uint uVar3;
  JSValueUnion proto;
  JSValue JVar4;
  
  proto = proto_val.u;
  if ((int)proto_val.tag != -1) {
    proto.float64 = 0.0;
  }
  uVar3 = (proto._4_4_ + proto.int32 * -0x61c8ffff) * -0x61c8ffff + 0x3c6e0001;
  bVar1 = -(char)ctx->rt->shape_hash_bits;
  ppJVar2 = ctx->rt->shape_hash + (uVar3 >> (bVar1 & 0x1f));
  do {
    sh = *ppJVar2;
    if (sh == (JSShape *)0x0) {
      sh = js_new_shape2(ctx,(JSObject *)proto.ptr,2,(uint)bVar1);
      if (sh == (JSShape *)0x0) {
        JVar4 = (JSValue)(ZEXT816(6) << 0x40);
      }
      else {
LAB_00116bed:
        JVar4 = JS_NewObjectFromShape(ctx,sh,class_id);
      }
      return JVar4;
    }
    if (((sh->hash == uVar3) && (sh->proto == (JSObject *)proto.ptr)) && (sh->prop_count == 0)) {
      (sh->header).ref_count = (sh->header).ref_count + 1;
      goto LAB_00116bed;
    }
    ppJVar2 = &sh->shape_hash_next;
  } while( true );
}

Assistant:

JSValue JS_NewObjectProtoClass(JSContext *ctx, JSValueConst proto_val,
                               JSClassID class_id)
{
    JSShape *sh;
    JSObject *proto;

    proto = get_proto_obj(proto_val);
    sh = find_hashed_shape_proto(ctx->rt, proto);
    if (likely(sh)) {
        sh = js_dup_shape(sh);
    } else {
        sh = js_new_shape(ctx, proto);
        if (!sh)
            return JS_EXCEPTION;
    }
    return JS_NewObjectFromShape(ctx, sh, class_id);
}